

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

vec3 __thiscall rengine::mat4::operator*(mat4 *this,vec3 v)

{
  vec3 vVar1;
  mat4 *this_local;
  float local_20;
  float fStack_1c;
  vec3 v_local;
  float local_c;
  
  v_local.x = v.z;
  local_20 = v.x;
  fStack_1c = v.y;
  vec3::vec3((vec3 *)&v_local.y,
             this->m[2] * v_local.x + this->m[0] * local_20 + this->m[1] * fStack_1c + this->m[3],
             this->m[6] * v_local.x + this->m[4] * local_20 + this->m[5] * fStack_1c + this->m[7],
             this->m[10] * v_local.x + this->m[8] * local_20 + this->m[9] * fStack_1c + this->m[0xb]
            );
  vVar1.z = local_c;
  vVar1.x = v_local.y;
  vVar1.y = v_local.z;
  return vVar1;
}

Assistant:

vec3 operator*(vec3 v) const {
        return vec3(m[0] * v.x + m[1] * v.y + m[ 2] * v.z + m[ 3],
                    m[4] * v.x + m[5] * v.y + m[ 6] * v.z + m[ 7],
                    m[8] * v.x + m[9] * v.y + m[10] * v.z + m[11]);
    }